

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Account::deposit_amount(Account *this,float x)

{
  while (x <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n Enter a positive value:\t",0x1a);
    std::istream::_M_extract<float>((float *)&std::cin);
  }
  this->deposit = x + this->deposit;
  return;
}

Assistant:

void Account::deposit_amount(float x)
{
    /*!
     * It helps to deposit money into account by amount x
     */
    while (x <= 0){
        std::cout << "\n Enter a positive value:\t";
        std::cin >> x;
    }
    deposit+=x;
}